

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

char * end_capture(MatchState *ms,char *s,char *p)

{
  int iVar1;
  char *pcVar2;
  char *res;
  int l;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  iVar1 = capture_to_close(ms);
  ms->capture[iVar1].len = (long)s - (long)ms->capture[iVar1].init;
  pcVar2 = match(ms,s,p);
  if (pcVar2 == (char *)0x0) {
    ms->capture[iVar1].len = -1;
  }
  return pcVar2;
}

Assistant:

static const char *end_capture (MatchState *ms, const char *s,
                                  const char *p) {
  int l = capture_to_close(ms);
  const char *res;
  ms->capture[l].len = s - ms->capture[l].init;  /* close capture */
  if ((res = match(ms, s, p)) == NULL)  /* match failed? */
    ms->capture[l].len = CAP_UNFINISHED;  /* undo capture */
  return res;
}